

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_adc_CC(TCGContext_conflict1 *tcg_ctx,TCGv_i32 dest,TCGv_i32 t0,TCGv_i32 t1)

{
  uintptr_t o_1;
  TCGTemp *a1;
  TCGv_i32 pTVar1;
  uintptr_t o_6;
  uintptr_t o_4;
  uintptr_t o_3;
  uintptr_t o_5;
  TCGv_i32 ah;
  
  a1 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  ah = (TCGv_i32)((long)a1 - (long)tcg_ctx);
  tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i32,(TCGArg)a1,0);
  tcg_gen_add2_i32_aarch64(tcg_ctx,tcg_ctx->cpu_NF,tcg_ctx->cpu_CF,t0,ah,tcg_ctx->cpu_CF,ah);
  tcg_gen_add2_i32_aarch64
            (tcg_ctx,tcg_ctx->cpu_NF,tcg_ctx->cpu_CF,tcg_ctx->cpu_NF,tcg_ctx->cpu_CF,t1,ah);
  pTVar1 = tcg_ctx->cpu_ZF;
  if (pTVar1 != tcg_ctx->cpu_NF) {
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(pTVar1 + (long)tcg_ctx),
                        (TCGArg)(tcg_ctx->cpu_NF + (long)tcg_ctx));
    pTVar1 = tcg_ctx->cpu_NF;
  }
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_xor_i32,(TCGArg)(tcg_ctx->cpu_VF + (long)tcg_ctx),
                      (TCGArg)(pTVar1 + (long)tcg_ctx),(TCGArg)(t0 + (long)tcg_ctx));
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_xor_i32,(TCGArg)a1,(TCGArg)(t0 + (long)tcg_ctx),
                      (TCGArg)(t1 + (long)tcg_ctx));
  tcg_gen_andc_i32_aarch64(tcg_ctx,tcg_ctx->cpu_VF,tcg_ctx->cpu_VF,ah);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ah + (long)tcg_ctx));
  if (tcg_ctx->cpu_NF != dest) {
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(dest + (long)tcg_ctx),
                        (TCGArg)(tcg_ctx->cpu_NF + (long)tcg_ctx));
    return;
  }
  return;
}

Assistant:

static void gen_adc_CC(TCGContext *tcg_ctx, TCGv_i32 dest, TCGv_i32 t0, TCGv_i32 t1)
{
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    if (TCG_TARGET_HAS_add2_i32) {
        tcg_gen_movi_i32(tcg_ctx, tmp, 0);
        tcg_gen_add2_i32(tcg_ctx, tcg_ctx->cpu_NF, tcg_ctx->cpu_CF, t0, tmp, tcg_ctx->cpu_CF, tmp);
        tcg_gen_add2_i32(tcg_ctx, tcg_ctx->cpu_NF, tcg_ctx->cpu_CF, tcg_ctx->cpu_NF, tcg_ctx->cpu_CF, t1, tmp);
    } else {
        TCGv_i64 q0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 q1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_extu_i32_i64(tcg_ctx, q0, t0);
        tcg_gen_extu_i32_i64(tcg_ctx, q1, t1);
        tcg_gen_add_i64(tcg_ctx, q0, q0, q1);
        tcg_gen_extu_i32_i64(tcg_ctx, q1, tcg_ctx->cpu_CF);
        tcg_gen_add_i64(tcg_ctx, q0, q0, q1);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_NF, tcg_ctx->cpu_CF, q0);
        tcg_temp_free_i64(tcg_ctx, q0);
        tcg_temp_free_i64(tcg_ctx, q1);
    }
    tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_ZF, tcg_ctx->cpu_NF);
    tcg_gen_xor_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_NF, t0);
    tcg_gen_xor_i32(tcg_ctx, tmp, t0, t1);
    tcg_gen_andc_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_VF, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
    tcg_gen_mov_i32(tcg_ctx, dest, tcg_ctx->cpu_NF);
}